

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::IsValid(ON_wString *this,bool bLengthTest)

{
  int iVar1;
  int iVar2;
  __int_type _Var3;
  ON_wStringHeader *pOVar4;
  bool bVar5;
  wchar_t *s1;
  int ref_count;
  int string_length;
  int string_capacity;
  ON_wStringHeader *hdr;
  wchar_t *s;
  bool bLengthTest_local;
  ON_wString *this_local;
  
  if (this->m_s == pEmptywString) {
    return true;
  }
  hdr = (ON_wStringHeader *)this->m_s;
  if (((((hdr == (ON_wStringHeader *)0x0) ||
        (pOVar4 = Header(this), pOVar4 == (ON_wStringHeader *)0x0)) ||
       (iVar1 = pOVar4->string_capacity, iVar1 < 1)) ||
      ((0xfffffffe < (ulong)(long)iVar1 || (iVar2 = pOVar4->string_length, iVar2 < 0)))) ||
     ((iVar1 < iVar2 ||
      ((_Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)pOVar4), _Var3 < 1 ||
       (pOVar4 = (ON_wStringHeader *)(&hdr->ref_count + iVar2), pOVar4 < hdr)))))) {
LAB_0099278e:
    this->m_s = pEmptywString;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x13c,"","Corrupt ON_wString - crash prevented.");
    this_local._7_1_ = false;
  }
  else {
    if (bLengthTest) {
      while( true ) {
        bVar5 = false;
        if (hdr < pOVar4) {
          bVar5 = (hdr->ref_count).super___atomic_base<int>._M_i != 0;
        }
        if (!bVar5) break;
        hdr = (ON_wStringHeader *)&hdr->string_length;
      }
      if ((hdr != pOVar4) || ((hdr->ref_count).super___atomic_base<int>._M_i != 0))
      goto LAB_0099278e;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::IsValid(
  bool bLengthTest
) const
{
  if (m_s == pEmptywString)
    return true;
  for (;;)
  {
    // These checks attempt to detect cases when the memory used for the header information
    // no longer contains valid settings.
    const wchar_t* s = m_s;
    if (nullptr == s)
      break;
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN) && defined(ON_64BIT_RUNTIME)
    // WINDOWS 64-bit pointer brackets in debug heap
    // https://docs.microsoft.com/en-us/windows-hardware/drivers/gettingstarted/virtual-address-spaces
    if (((ON__UINT_PTR)s) <= 0x10000ull)
      break;
    if (((ON__UINT_PTR)s) > 0x7FFFFFFFFFFull)
      break;
    if (0 != ((ON__UINT_PTR)s) % 4)
      break;
#endif
    const ON_wStringHeader* hdr = Header();
    if (nullptr == hdr)
      break;

#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN) && defined(ON_64BIT_RUNTIME)
    if (0 != ((ON__UINT_PTR)hdr) % 8)
      break;
#endif

    // If the string is corrupt, there may be a crash on one of the 3 const int xxx = hdr->xxx; lines.
    // But, if we do nothing that crash that was going to happen in the very near future when
    // the code calling this function tries to use the string.
    // If the memory was recently freed or corrupted, there is a non-zero chance
    // these checks will break out of the for(;;){} scope, we will prevent
    // the crash by setting "this" to the empty string.
    const int string_capacity = hdr->string_capacity;
    if (string_capacity <= 0)
      break;
    if (string_capacity > ON_wString::MaximumStringLength)
      break;
    const int string_length = hdr->string_length;
    if (string_length < 0)
      break;
    if (string_length > string_capacity)
      break;
    const int ref_count = (int)(hdr->ref_count);
    if (ref_count <= 0)
      break;
    const wchar_t* s1 = s + string_length;
    if (s1 < s)
    {
      // overflow check
      break;
    }
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN) && defined(ON_64BIT_RUNTIME)
    // WINDOWS 64-bit pointer brackets in debug heap
    // https://docs.microsoft.com/en-us/windows-hardware/drivers/gettingstarted/virtual-address-spaces
    if (((ON__UINT_PTR)s1) <= 0x10000ull)
      break;
    if (((ON__UINT_PTR)s1) > 0x7FFFFFFFFFFull)
      break;
#endif
    if (bLengthTest)
    {
      // Because the ON_wString m_s[] array can have internal null elements,
      // the length test has to be enabled in situations where it is certain
      // that we are in the common situation where m_s[] is a single null terminated
      // sting and hdr->string_length is the m_s[] index of the null terminator.
      while (s < s1 && 0 != *s)
        s++;
      if (s != s1)
        break;
      if (0 != *s)
        break;
    }
    return true;
  }
  // prevent imminent and unpredictable crash
  //
  // The empty string is used (as opposed to something like "YIKES - CALL TECH SUPPORT")
  // because anything besides the empty string introduces using heap in a class that
  // has been corrupted by some earlier operation.
  const_cast<ON_wString*>(this)->m_s = (wchar_t*)pEmptywString;
  // Devs
  //  If you get this error, some earlier operation corrupted the string
  //  It is critical to track this bug down ASAP.
  ON_ERROR("Corrupt ON_wString - crash prevented.");
  return false;
}